

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

void __thiscall
FIX::MessageStoreExceptionWrapper::incrNextTargetMsgSeqNum
          (MessageStoreExceptionWrapper *this,bool *threw,IOException *ex)

{
  IOException *e;
  IOException *ex_local;
  bool *threw_local;
  MessageStoreExceptionWrapper *this_local;
  
  *threw = false;
  (**(code **)(**(long **)this + 0x48))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::incrNextTargetMsgSeqNum( bool& threw, IOException& ex )
{
  threw = false;
  try { m_pStore->incrNextTargetMsgSeqNum(); }
  catch ( IOException & e ) { threw = true; ex = e; }
}